

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O2

int __thiscall ncnn::Fold::load_param(Fold *this,ParamDict *pd)

{
  int iVar1;
  
  iVar1 = ParamDict::get(pd,1,0);
  this->kernel_w = iVar1;
  iVar1 = ParamDict::get(pd,0xb,iVar1);
  this->kernel_h = iVar1;
  iVar1 = ParamDict::get(pd,2,1);
  this->dilation_w = iVar1;
  iVar1 = ParamDict::get(pd,0xc,iVar1);
  this->dilation_h = iVar1;
  iVar1 = ParamDict::get(pd,3,1);
  this->stride_w = iVar1;
  iVar1 = ParamDict::get(pd,0xd,iVar1);
  this->stride_h = iVar1;
  iVar1 = ParamDict::get(pd,4,0);
  this->pad_left = iVar1;
  iVar1 = ParamDict::get(pd,0xf,iVar1);
  this->pad_right = iVar1;
  iVar1 = ParamDict::get(pd,0xe,this->pad_left);
  this->pad_top = iVar1;
  iVar1 = ParamDict::get(pd,0x10,iVar1);
  this->pad_bottom = iVar1;
  iVar1 = ParamDict::get(pd,0x14,0);
  this->output_w = iVar1;
  iVar1 = ParamDict::get(pd,0x15,iVar1);
  this->output_h = iVar1;
  return 0;
}

Assistant:

int Fold::load_param(const ParamDict& pd)
{
    kernel_w = pd.get(1, 0);
    kernel_h = pd.get(11, kernel_w);
    dilation_w = pd.get(2, 1);
    dilation_h = pd.get(12, dilation_w);
    stride_w = pd.get(3, 1);
    stride_h = pd.get(13, stride_w);
    pad_left = pd.get(4, 0);
    pad_right = pd.get(15, pad_left);
    pad_top = pd.get(14, pad_left);
    pad_bottom = pd.get(16, pad_top);
    output_w = pd.get(20, 0);
    output_h = pd.get(21, output_w);

    return 0;
}